

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrLocateSceneComponentsMSFT
                   (XrSceneMSFT scene,XrSceneComponentsLocateInfoMSFT *locateInfo,
                   XrSceneComponentLocationsMSFT *locations)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrResult XVar3;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrSceneMSFT_T *in_stack_fffffffffffffd68;
  string local_290;
  string local_270;
  XrSceneMSFT scene_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9c44e9;
  scene_local = scene;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSceneMSFT_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&scene_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSceneMSFTHandle(&scene_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSceneMSFT_T_*>::getWithInstanceInfo(&g_scenemsft_info,scene_local);
    instance_info = pVar4.second;
    if (locateInfo == (XrSceneComponentsLocateInfoMSFT *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrLocateSceneComponentsMSFT-locateInfo-parameter",
                 (allocator *)&local_230);
      std::__cxx11::string::string
                ((string *)&local_290,"xrLocateSceneComponentsMSFT",
                 (allocator *)&stack0xfffffffffffffd6f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Invalid NULL for XrSceneComponentsLocateInfoMSFT \"locateInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd6e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_1c8;
    }
    else {
      std::__cxx11::string::string
                ((string *)&oss,"xrLocateSceneComponentsMSFT",(allocator *)&local_290);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,locateInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrLocateSceneComponentsMSFT-locateInfo-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrLocateSceneComponentsMSFT",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Command xrLocateSceneComponentsMSFT param locateInfo is invalid",
                   (allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e0,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1e0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&oss);
        goto LAB_001dd401;
      }
      if (locations == (XrSceneComponentLocationsMSFT *)0x0) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrLocateSceneComponentsMSFT-locations-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrLocateSceneComponentsMSFT",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Invalid NULL for XrSceneComponentLocationsMSFT \"locations\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f8,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_1f8;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"xrLocateSceneComponentsMSFT",(allocator *)&local_290);
        XVar2 = XR_SUCCESS;
        XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,locations);
        std::__cxx11::string::~string((string *)&oss);
        if (XVar3 == XR_SUCCESS) goto LAB_001dd401;
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrLocateSceneComponentsMSFT-locations-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrLocateSceneComponentsMSFT",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_210,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Command xrLocateSceneComponentsMSFT param locations is invalid",
                   (allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_210,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_210;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSceneMSFT handle \"scene\" ");
    HandleToHexString<XrSceneMSFT_T*>(in_stack_fffffffffffffd68);
    std::operator<<((ostream *)&oss,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrLocateSceneComponentsMSFT-scene-parameter",
               (allocator *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::string
              ((string *)&local_270,"xrLocateSceneComponentsMSFT",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_290,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001dd401:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrLocateSceneComponentsMSFT(
XrSceneMSFT scene,
const XrSceneComponentsLocateInfoMSFT* locateInfo,
XrSceneComponentLocationsMSFT* locations) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(scene, XR_OBJECT_TYPE_SCENE_MSFT);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSceneMSFTHandle(&scene);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSceneMSFT handle \"scene\" ";
                oss << HandleToHexString(scene);
                CoreValidLogMessage(nullptr, "VUID-xrLocateSceneComponentsMSFT-scene-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSceneComponentsMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_scenemsft_info.getWithInstanceInfo(scene);
        GenValidUsageXrHandleInfo *gen_scenemsft_info = info_with_instance.first;
        (void)gen_scenemsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == locateInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSceneComponentsMSFT-locateInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSceneComponentsMSFT", objects_info,
                                "Invalid NULL for XrSceneComponentsLocateInfoMSFT \"locateInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSceneComponentsLocateInfoMSFT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateSceneComponentsMSFT", objects_info,
                                                        true, true, locateInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSceneComponentsMSFT-locateInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSceneComponentsMSFT",
                                objects_info,
                                "Command xrLocateSceneComponentsMSFT param locateInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == locations) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSceneComponentsMSFT-locations-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSceneComponentsMSFT", objects_info,
                                "Invalid NULL for XrSceneComponentLocationsMSFT \"locations\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSceneComponentLocationsMSFT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrLocateSceneComponentsMSFT", objects_info,
                                                        false, true, locations);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrLocateSceneComponentsMSFT-locations-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrLocateSceneComponentsMSFT",
                                objects_info,
                                "Command xrLocateSceneComponentsMSFT param locations is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}